

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmu-uuid.cpp
# Opt level: O0

string * Replace(string *__return_storage_ptr__,string *haystack,string *needle,string *replacement)

{
  long lVar1;
  long lVar2;
  size_type j;
  size_type i;
  string *replacement_local;
  string *needle_local;
  string *haystack_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  j = 0;
  while( true ) {
    lVar1 = std::__cxx11::string::find((string *)haystack,(ulong)needle);
    std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)haystack,j);
    if (lVar1 == -1) break;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    lVar2 = std::__cxx11::string::size();
    j = lVar1 + lVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Replace(
    const std::string& haystack,
    const std::string& needle,
    const std::string& replacement)
{
    auto output = std::string{};
    output.reserve(haystack.size());
    std::string::size_type i = 0;
    while (true) {
        const auto j = haystack.find(needle, i);
        output.append(haystack, i, j-i);
        if (j == std::string::npos) break;
        output.append(replacement);
        i = j + needle.size();
    }
    return output;
}